

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_decompressSequences_bmi2
                 (ZSTD_DCtx *dctx,void *dst,size_t maxDstSize,void *seqStart,size_t seqSize,
                 int nbSeq,ZSTD_longOffset_e isLongOffset,int frame)

{
  seq_t sequence_00;
  BYTE *pBVar1;
  uint uVar2;
  BYTE *litLimit;
  size_t sVar3;
  long lVar4;
  ulong __n;
  BYTE *in_RCX;
  long in_RDX;
  BYTE *in_RSI;
  long in_RDI;
  BYTE *in_R8;
  int in_R9D;
  bool bVar5;
  int in_stack_00000008;
  size_t lastLLSize;
  U32 i_1;
  size_t oneSeqSize;
  seq_t sequence;
  U32 i;
  seqState_t seqState;
  BYTE *dictEnd;
  BYTE *vBase;
  BYTE *prefixStart;
  BYTE *litEnd;
  BYTE *litPtr;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  BYTE *iend;
  BYTE *ip;
  BIT_DStream_status result_7;
  U32 nbBytes_7;
  BIT_DStream_status result_6;
  U32 nbBytes_6;
  size_t temp;
  U32 ll0;
  U32 extraBits;
  size_t offset;
  U32 ofnbBits;
  U32 mlnbBits;
  U32 llnbBits;
  U16 ofNext;
  U16 mlNext;
  U16 llNext;
  BYTE totalBits;
  BYTE ofBits;
  BYTE mlBits;
  BYTE llBits;
  U32 ofBase;
  ZSTD_seqSymbol *ofDInfo;
  ZSTD_seqSymbol *mlDInfo;
  ZSTD_seqSymbol *llDInfo;
  BIT_DStream_status result_5;
  U32 nbBytes_5;
  BIT_DStream_status result_4;
  U32 nbBytes_4;
  BIT_DStream_status result_3;
  U32 nbBytes_3;
  BIT_DStream_status result_2;
  U32 nbBytes_2;
  BIT_DStream_status result_1;
  U32 nbBytes_1;
  BIT_DStream_status result;
  U32 nbBytes;
  size_t length1;
  BYTE *match;
  BYTE *iLitEnd;
  BYTE *oend_w;
  BYTE *oMatchEnd;
  size_t sequenceLength;
  BYTE *oLitEnd;
  BYTE *oend_3;
  BYTE *op_3;
  BYTE *ip_3;
  ptrdiff_t diff_2;
  BYTE *oend_2;
  BYTE *op_2;
  BYTE *ip_2;
  ptrdiff_t diff_1;
  BYTE *oend_1;
  BYTE *op_1;
  BYTE *ip_1;
  ptrdiff_t diff;
  size_t lowBits_2;
  size_t value_2;
  U32 regMask_2;
  size_t lowBits_1;
  size_t value_1;
  U32 regMask_1;
  size_t lowBits;
  size_t value;
  U32 regMask;
  int sub2;
  BIT_DStream_t *in_stack_fffffffffffffa68;
  uint nbBits;
  BIT_DStream_t *in_stack_fffffffffffffa70;
  ZSTD_seqSymbol *in_stack_fffffffffffffa78;
  BIT_DStream_t *in_stack_fffffffffffffa80;
  undefined6 in_stack_fffffffffffffa88;
  undefined1 in_stack_fffffffffffffa8e;
  undefined1 in_stack_fffffffffffffa8f;
  ulong local_570;
  BYTE *in_stack_fffffffffffffaa0;
  BYTE *in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab8;
  undefined8 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  BYTE *in_stack_fffffffffffffaf8;
  BIT_DStream_t *local_500;
  BIT_DStream_t *local_4f8;
  uint local_4e4;
  ulong local_4e0;
  uint local_4d8;
  ulong local_4d0;
  ulong local_4c8;
  ulong local_4c0;
  long local_4b8;
  long local_4b0;
  long local_4a8;
  long local_4a0;
  long local_498;
  long local_490;
  BYTE *local_488 [4];
  long local_468;
  BYTE *local_460;
  void *local_458;
  void *local_450;
  BYTE *local_448;
  BYTE *local_440;
  BYTE *local_438;
  BYTE *local_430;
  int local_418;
  int local_414;
  BYTE *local_3f8;
  long local_3f0;
  BYTE *local_3e8;
  BIT_DStream_status local_3e0;
  uint local_3dc;
  size_t *local_3d8;
  BIT_DStream_status local_3cc;
  BIT_DStream_status local_3c8;
  uint local_3c4;
  size_t *local_3c0;
  BIT_DStream_status local_3b4;
  BYTE *local_3b0;
  uint local_3a8;
  undefined4 local_3a4;
  BYTE *local_3a0;
  uint local_394;
  uint local_390;
  uint local_38c;
  ushort local_386;
  ushort local_384;
  ushort local_382;
  byte local_380;
  byte local_37f;
  byte local_37e;
  byte local_37d;
  uint local_37c;
  ushort *local_378;
  ushort *local_370;
  ushort *local_368;
  int local_35c;
  ulong *local_358;
  BIT_DStream_status local_350;
  uint local_34c;
  ulong *local_348;
  BIT_DStream_status local_33c;
  BIT_DStream_status local_338;
  uint local_334;
  ulong *local_330;
  BIT_DStream_status local_324;
  BIT_DStream_status local_320;
  uint local_31c;
  ulong *local_318;
  BIT_DStream_status local_30c;
  BIT_DStream_status local_308;
  uint local_304;
  ulong *local_300;
  BIT_DStream_status local_2f4;
  BIT_DStream_status local_2f0;
  uint local_2ec;
  ulong *local_2e8;
  BIT_DStream_status local_2dc;
  BIT_DStream_status local_2d8;
  uint local_2d4;
  ulong *local_2d0;
  BIT_DStream_status local_2c4;
  BIT_DStream_t *local_2c0;
  BIT_DStream_t *local_2b8;
  BYTE *local_2b0;
  size_t local_2a8;
  BYTE *local_2a0;
  void *local_298;
  BYTE *local_290;
  BYTE *local_288;
  BYTE *local_280;
  BYTE *local_278;
  BYTE *local_270;
  long local_268;
  BYTE *local_260;
  void *local_258;
  void **local_250;
  BYTE *local_248;
  BYTE *local_240;
  BYTE *local_238;
  BYTE *local_230;
  BYTE *local_228;
  BYTE *local_220;
  long local_218;
  undefined4 local_20c;
  char **local_208;
  BYTE *local_200;
  BYTE *local_1f8;
  BYTE *local_1f0;
  BYTE *local_1e8;
  BYTE *local_1e0;
  long local_1d8;
  undefined4 local_1cc;
  BIT_DStream_t *local_1c8;
  BYTE *local_1c0;
  BYTE *local_1b8;
  BYTE *local_1b0;
  BYTE *local_1a8;
  void *local_1a0;
  long local_198;
  undefined4 local_18c;
  char **local_188;
  void *local_180;
  BYTE *local_178;
  ulong local_170;
  uint local_168;
  ushort local_162;
  ulong *local_160;
  ulong *local_158;
  ulong local_150;
  uint local_144;
  ulong *local_140;
  uint local_134;
  ulong *local_130;
  uint local_124;
  ulong *local_120;
  undefined4 local_114;
  uint local_110;
  int local_10c;
  ulong local_108;
  ulong local_100;
  uint local_f8;
  ushort local_f2;
  ulong *local_f0;
  ulong *local_e8;
  ulong local_e0;
  uint local_d4;
  ulong *local_d0;
  uint local_c4;
  ulong *local_c0;
  uint local_b4;
  ulong *local_b0;
  undefined4 local_a4;
  uint local_a0;
  int local_9c;
  ulong local_98;
  ulong local_90;
  uint local_88;
  ushort local_82;
  ulong *local_80;
  ulong *local_78;
  ulong local_70;
  uint local_64;
  ulong *local_60;
  uint local_54;
  ulong *local_50;
  uint local_44;
  ulong *local_40;
  undefined4 local_34;
  uint local_30;
  int local_2c;
  ulong local_28;
  int local_1c;
  BYTE *local_18;
  BYTE **local_10;
  BYTE **local_8;
  
  local_418 = in_stack_00000008;
  local_430 = in_RCX + (long)in_R8;
  if (*(int *)(in_RDI + 0x76a0) == 0) {
    litLimit = in_RSI + in_RDX;
  }
  else {
    litLimit = *(BYTE **)(in_RDI + 0x7690);
  }
  local_450 = *(void **)(in_RDI + 0x75a8);
  local_458 = (void *)((long)local_450 + *(long *)(in_RDI + 0x75c8));
  local_460 = *(BYTE **)(in_RDI + 0x74c8);
  local_468 = *(long *)(in_RDI + 0x74d0);
  local_488[3] = *(BYTE **)(in_RDI + 0x74d8);
  local_448 = in_RSI;
  local_440 = litLimit;
  local_438 = in_RSI;
  local_414 = in_R9D;
  if (in_R9D == 0) {
LAB_0043eefe:
    __n = (long)local_458 - (long)local_450;
    if ((ulong)((long)local_440 - (long)local_448) < __n) {
      local_3e8 = (BYTE *)0xffffffffffffffba;
    }
    else {
      if (local_448 != (BYTE *)0x0) {
        memcpy(local_448,local_450,__n);
        local_448 = local_448 + __n;
      }
      local_3e8 = local_448 + -(long)local_438;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0x7534) = 1;
    for (local_4e4 = 0; local_4e4 < 3; local_4e4 = local_4e4 + 1) {
      local_488[local_4e4] = (BYTE *)(ulong)*(uint *)(in_RDI + 0x683c + (ulong)local_4e4 * 4);
    }
    local_3f8 = in_RSI;
    local_3f0 = in_RDI;
    sVar3 = BIT_initDStream((BIT_DStream_t *)
                            CONCAT17(in_stack_fffffffffffffa8f,
                                     CONCAT16(in_stack_fffffffffffffa8e,in_stack_fffffffffffffa88)),
                            in_stack_fffffffffffffa80,(size_t)in_stack_fffffffffffffa78);
    uVar2 = ERR_isError(sVar3);
    if (uVar2 == 0) {
      ZSTD_initFseState((ZSTD_fseState *)
                        CONCAT17(in_stack_fffffffffffffa8f,
                                 CONCAT16(in_stack_fffffffffffffa8e,in_stack_fffffffffffffa88)),
                        in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      ZSTD_initFseState((ZSTD_fseState *)
                        CONCAT17(in_stack_fffffffffffffa8f,
                                 CONCAT16(in_stack_fffffffffffffa8e,in_stack_fffffffffffffa88)),
                        in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      ZSTD_initFseState((ZSTD_fseState *)
                        CONCAT17(in_stack_fffffffffffffa8f,
                                 CONCAT16(in_stack_fffffffffffffa8e,in_stack_fffffffffffffa88)),
                        in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      if (local_3f8 == (BYTE *)0x0) {
        __assert_fail("dst != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0xaabe,
                      "size_t ZSTD_decompressSequences_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e, const int)"
                     );
      }
      do {
        local_358 = &local_4e0;
        local_35c = local_418;
        local_368 = (ushort *)(local_4b0 + local_4b8 * 8);
        local_370 = (ushort *)(local_490 + local_498 * 8);
        local_378 = (ushort *)(local_4a0 + local_4a8 * 8);
        local_4f8 = (BIT_DStream_t *)(ulong)*(uint *)(local_370 + 2);
        local_500 = (BIT_DStream_t *)(ulong)*(uint *)(local_368 + 2);
        local_37c = *(uint *)(local_378 + 2);
        local_37d = (byte)local_368[1];
        local_37e = (byte)local_370[1];
        local_37f = (byte)local_378[1];
        local_380 = local_37d + local_37e + local_37f;
        local_382 = *local_368;
        local_384 = *local_370;
        local_386 = *local_378;
        local_38c = (uint)*(byte *)((long)local_368 + 3);
        local_390 = (uint)*(byte *)((long)local_370 + 3);
        local_394 = (uint)*(byte *)((long)local_378 + 3);
        if (0x10 < local_37d) {
          __assert_fail("llBits <= MaxLLBits",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa948,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
        }
        if (0x10 < local_37e) {
          __assert_fail("mlBits <= MaxMLBits",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa949,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
        }
        if (0x1f < local_37f) {
          __assert_fail("ofBits <= MaxOff",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa94a,"seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e)");
        }
        if (local_37f < 2) {
          local_3a8 = (uint)(*(int *)(local_368 + 2) == 0);
          if (local_37f == 0) {
            local_3a0 = local_488[local_3a8];
            local_488[1] = local_488[(int)(uint)((local_3a8 != 0 ^ 0xffU) & 1)];
            local_488[0] = local_3a0;
          }
          else {
            uVar2 = local_37c + local_3a8;
            sVar3 = BIT_readBitsFast(in_stack_fffffffffffffa70,
                                     (uint)((ulong)in_stack_fffffffffffffa68 >> 0x20));
            lVar4 = uVar2 + sVar3;
            if (lVar4 == 3) {
              local_570 = local_358[0xb] - 1;
            }
            else {
              local_570 = local_358[lVar4 + 0xb];
            }
            local_3b0 = (BYTE *)((long)(int)(uint)((local_570 != 0 ^ 0xffU) & 1) + local_570);
            if (lVar4 != 1) {
              local_358[0xd] = local_358[0xc];
            }
            local_358[0xc] = local_358[0xb];
            local_3a0 = local_3b0;
            local_358[0xb] = (ulong)local_3b0;
          }
        }
        else {
          uVar2 = MEM_32bits();
          nbBits = (uint)((ulong)in_stack_fffffffffffffa68 >> 0x20);
          if (((uVar2 == 0) || (local_35c == 0)) || (local_37f < 0x19)) {
            in_stack_fffffffffffffaa0 = (BYTE *)(ulong)local_37c;
            sVar3 = BIT_readBitsFast(in_stack_fffffffffffffa70,nbBits);
            local_3a0 = in_stack_fffffffffffffaa0 + sVar3;
            uVar2 = MEM_32bits();
            if (uVar2 != 0) {
              local_2e8 = local_358;
              if ((uint)local_358[1] < 0x41) {
                if (local_358[2] < local_358[4]) {
                  if (local_358[2] == local_358[3]) {
                    if ((uint)local_358[1] < 0x40) {
                      local_2dc = BIT_DStream_endOfBuffer;
                    }
                    else {
                      local_2dc = BIT_DStream_completed;
                    }
                  }
                  else {
                    local_2ec = (uint)local_358[1] >> 3;
                    bVar5 = local_358[2] - (ulong)local_2ec < local_358[3];
                    if (bVar5) {
                      local_2ec = (int)local_358[2] - (int)local_358[3];
                    }
                    local_2f0 = (BIT_DStream_status)bVar5;
                    local_358[2] = local_358[2] - (ulong)local_2ec;
                    *(uint *)(local_2e8 + 1) = (int)local_2e8[1] + local_2ec * -8;
                    sVar3 = MEM_readLEST(in_stack_fffffffffffffa68);
                    *local_2e8 = sVar3;
                    local_2dc = local_2f0;
                  }
                }
                else {
                  local_2dc = BIT_reloadDStreamFast(in_stack_fffffffffffffa68);
                }
              }
              else {
                local_2dc = BIT_DStream_overflow;
              }
            }
          }
          else {
            local_3a4 = 5;
            in_stack_fffffffffffffaa8 = (BYTE *)(ulong)local_37c;
            sVar3 = BIT_readBitsFast(in_stack_fffffffffffffa70,nbBits);
            local_3a0 = in_stack_fffffffffffffaa8 + sVar3 * 0x20;
            local_2d0 = local_358;
            if ((uint)local_358[1] < 0x41) {
              if (local_358[2] < local_358[4]) {
                if (local_358[2] == local_358[3]) {
                  if ((uint)local_358[1] < 0x40) {
                    local_2c4 = BIT_DStream_endOfBuffer;
                  }
                  else {
                    local_2c4 = BIT_DStream_completed;
                  }
                }
                else {
                  local_2d4 = (uint)local_358[1] >> 3;
                  bVar5 = local_358[2] - (ulong)local_2d4 < local_358[3];
                  if (bVar5) {
                    local_2d4 = (int)local_358[2] - (int)local_358[3];
                  }
                  local_2d8 = (BIT_DStream_status)bVar5;
                  local_358[2] = local_358[2] - (ulong)local_2d4;
                  *(uint *)(local_2d0 + 1) = (int)local_2d0[1] + local_2d4 * -8;
                  sVar3 = MEM_readLEST(in_stack_fffffffffffffa68);
                  *local_2d0 = sVar3;
                  local_2c4 = local_2d8;
                }
              }
              else {
                local_2c4 = BIT_reloadDStreamFast(in_stack_fffffffffffffa68);
              }
            }
            else {
              local_2c4 = BIT_DStream_overflow;
            }
            sVar3 = BIT_readBitsFast(in_stack_fffffffffffffa70,
                                     (uint)((ulong)in_stack_fffffffffffffa68 >> 0x20));
            local_3a0 = local_3a0 + sVar3;
          }
          local_358[0xd] = local_358[0xc];
          local_358[0xc] = local_358[0xb];
          local_358[0xb] = (ulong)local_3a0;
        }
        pBVar1 = local_3a0;
        if (local_37e != 0) {
          sVar3 = BIT_readBitsFast(in_stack_fffffffffffffa70,
                                   (uint)((ulong)in_stack_fffffffffffffa68 >> 0x20));
          local_4f8 = (BIT_DStream_t *)((long)&local_4f8->bitContainer + sVar3);
        }
        uVar2 = MEM_32bits();
        if ((uVar2 != 0) && (0x13 < (uint)local_37e + (uint)local_37d)) {
          local_300 = local_358;
          if ((uint)local_358[1] < 0x41) {
            if (local_358[2] < local_358[4]) {
              if (local_358[2] == local_358[3]) {
                if ((uint)local_358[1] < 0x40) {
                  local_2f4 = BIT_DStream_endOfBuffer;
                }
                else {
                  local_2f4 = BIT_DStream_completed;
                }
              }
              else {
                local_304 = (uint)local_358[1] >> 3;
                bVar5 = local_358[2] - (ulong)local_304 < local_358[3];
                if (bVar5) {
                  local_304 = (int)local_358[2] - (int)local_358[3];
                }
                local_308 = (BIT_DStream_status)bVar5;
                local_358[2] = local_358[2] - (ulong)local_304;
                *(uint *)(local_300 + 1) = (int)local_300[1] + local_304 * -8;
                sVar3 = MEM_readLEST(in_stack_fffffffffffffa68);
                *local_300 = sVar3;
                local_2f4 = local_308;
              }
            }
            else {
              local_2f4 = BIT_reloadDStreamFast(in_stack_fffffffffffffa68);
            }
          }
          else {
            local_2f4 = BIT_DStream_overflow;
          }
        }
        uVar2 = MEM_64bits();
        if ((uVar2 != 0) && (0x1e < local_380)) {
          local_318 = local_358;
          if ((uint)local_358[1] < 0x41) {
            if (local_358[2] < local_358[4]) {
              if (local_358[2] == local_358[3]) {
                if ((uint)local_358[1] < 0x40) {
                  local_30c = BIT_DStream_endOfBuffer;
                }
                else {
                  local_30c = BIT_DStream_completed;
                }
              }
              else {
                local_31c = (uint)local_358[1] >> 3;
                bVar5 = local_358[2] - (ulong)local_31c < local_358[3];
                if (bVar5) {
                  local_31c = (int)local_358[2] - (int)local_358[3];
                }
                local_320 = (BIT_DStream_status)bVar5;
                local_358[2] = local_358[2] - (ulong)local_31c;
                *(uint *)(local_318 + 1) = (int)local_318[1] + local_31c * -8;
                sVar3 = MEM_readLEST(in_stack_fffffffffffffa68);
                *local_318 = sVar3;
                local_30c = local_320;
              }
            }
            else {
              local_30c = BIT_reloadDStreamFast(in_stack_fffffffffffffa68);
            }
          }
          else {
            local_30c = BIT_DStream_overflow;
          }
        }
        if (local_37d != 0) {
          sVar3 = BIT_readBitsFast(in_stack_fffffffffffffa70,
                                   (uint)((ulong)in_stack_fffffffffffffa68 >> 0x20));
          local_500 = (BIT_DStream_t *)((long)&local_500->bitContainer + sVar3);
        }
        uVar2 = MEM_32bits();
        if (uVar2 != 0) {
          local_330 = local_358;
          if ((uint)local_358[1] < 0x41) {
            if (local_358[2] < local_358[4]) {
              if (local_358[2] == local_358[3]) {
                if ((uint)local_358[1] < 0x40) {
                  local_324 = BIT_DStream_endOfBuffer;
                }
                else {
                  local_324 = BIT_DStream_completed;
                }
              }
              else {
                local_334 = (uint)local_358[1] >> 3;
                bVar5 = local_358[2] - (ulong)local_334 < local_358[3];
                if (bVar5) {
                  local_334 = (int)local_358[2] - (int)local_358[3];
                }
                local_338 = (BIT_DStream_status)bVar5;
                local_358[2] = local_358[2] - (ulong)local_334;
                *(uint *)(local_330 + 1) = (int)local_330[1] + local_334 * -8;
                sVar3 = MEM_readLEST(in_stack_fffffffffffffa68);
                *local_330 = sVar3;
                local_324 = local_338;
              }
            }
            else {
              local_324 = BIT_reloadDStreamFast(in_stack_fffffffffffffa68);
            }
          }
          else {
            local_324 = BIT_DStream_overflow;
          }
        }
        local_78 = local_358 + 5;
        local_80 = local_358;
        local_82 = local_382;
        local_88 = local_38c;
        local_60 = local_358;
        local_64 = local_38c;
        local_50 = local_358;
        local_54 = local_38c;
        local_28 = *local_358;
        local_2c = (0x40 - (int)local_358[1]) - local_38c;
        local_30 = local_38c;
        local_34 = 0x3f;
        local_70 = local_28 >> ((byte)local_2c & 0x3f) & (1L << ((byte)local_38c & 0x3f)) - 1U;
        local_40 = local_358;
        local_44 = local_38c;
        *(uint *)(local_358 + 1) = local_38c + (int)local_358[1];
        local_90 = local_70;
        *local_78 = local_82 + local_70;
        local_e8 = local_358 + 9;
        local_f0 = local_358;
        local_f2 = local_384;
        local_f8 = local_390;
        local_d0 = local_358;
        local_d4 = local_390;
        local_c0 = local_358;
        local_c4 = local_390;
        local_98 = *local_358;
        local_9c = (0x40 - (int)local_358[1]) - local_390;
        local_a0 = local_390;
        local_a4 = 0x3f;
        local_e0 = local_98 >> ((byte)local_9c & 0x3f) & (1L << ((byte)local_390 & 0x3f)) - 1U;
        local_b0 = local_358;
        local_b4 = local_390;
        *(uint *)(local_358 + 1) = local_390 + (int)local_358[1];
        local_100 = local_e0;
        *local_e8 = local_f2 + local_e0;
        uVar2 = MEM_32bits();
        if (uVar2 != 0) {
          local_348 = local_358;
          if ((uint)local_358[1] < 0x41) {
            if (local_358[2] < local_358[4]) {
              if (local_358[2] == local_358[3]) {
                if ((uint)local_358[1] < 0x40) {
                  local_33c = BIT_DStream_endOfBuffer;
                }
                else {
                  local_33c = BIT_DStream_completed;
                }
              }
              else {
                local_34c = (uint)local_358[1] >> 3;
                bVar5 = local_358[2] - (ulong)local_34c < local_358[3];
                if (bVar5) {
                  local_34c = (int)local_358[2] - (int)local_358[3];
                }
                local_350 = (BIT_DStream_status)bVar5;
                local_358[2] = local_358[2] - (ulong)local_34c;
                *(uint *)(local_348 + 1) = (int)local_348[1] + local_34c * -8;
                sVar3 = MEM_readLEST(in_stack_fffffffffffffa68);
                *local_348 = sVar3;
                local_33c = local_350;
              }
            }
            else {
              local_33c = BIT_reloadDStreamFast(in_stack_fffffffffffffa68);
            }
          }
          else {
            local_33c = BIT_DStream_overflow;
          }
        }
        local_158 = local_358 + 7;
        local_160 = local_358;
        local_162 = local_386;
        local_168 = local_394;
        local_140 = local_358;
        local_144 = local_394;
        local_130 = local_358;
        local_134 = local_394;
        local_108 = *local_358;
        local_10c = (0x40 - (int)local_358[1]) - local_394;
        local_110 = local_394;
        local_114 = 0x3f;
        local_150 = local_108 >> ((byte)local_10c & 0x3f) & (1L << ((byte)local_394 & 0x3f)) - 1U;
        local_120 = local_358;
        local_124 = local_394;
        *(uint *)(local_358 + 1) = local_394 + (int)local_358[1];
        local_170 = local_150;
        *local_158 = local_162 + local_150;
        local_2c0 = local_500;
        local_2b8 = local_4f8;
        local_2b0 = pBVar1;
        local_240 = local_448;
        local_248 = local_440;
        local_250 = &local_450;
        local_258 = local_458;
        local_260 = local_460;
        local_268 = local_468;
        local_270 = local_488[3];
        local_278 = local_448 + (long)local_500;
        local_280 = (BYTE *)((long)&local_4f8->bitContainer + (long)&local_500->bitContainer);
        local_288 = local_448 + (long)local_280;
        local_290 = local_440 + -0x20;
        local_298 = (void *)((long)local_450 + (long)local_500);
        local_2a0 = local_278 + -(long)pBVar1;
        if (local_448 == (BYTE *)0x0) {
          __assert_fail("op != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa850,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        if (local_440 <= local_290) {
          __assert_fail("oend_w < oend",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0xa851,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        bVar5 = true;
        if ((local_298 <= local_458) && (bVar5 = true, local_288 <= local_290)) {
          uVar2 = MEM_32bits();
          bVar5 = uVar2 != 0 && local_248 + -(long)local_240 < local_280 + 0x20;
        }
        if (bVar5) {
          sequence_00.matchLength = in_stack_fffffffffffffae8;
          sequence_00.litLength = in_RDI;
          sequence_00.offset._0_4_ = in_stack_fffffffffffffaf0;
          sequence_00.offset._4_4_ = in_stack_fffffffffffffaf4;
          in_stack_fffffffffffffa68 = local_2c0;
          in_stack_fffffffffffffa70 = local_2b8;
          local_238 = (BYTE *)ZSTD_execSequenceEnd
                                        (in_RCX,in_R8,sequence_00,
                                         (BYTE **)CONCAT44(in_R9D,in_stack_fffffffffffffab8),
                                         litLimit,in_stack_fffffffffffffaa8,
                                         in_stack_fffffffffffffaa0,in_stack_fffffffffffffaf8);
        }
        else {
          if (local_278 < local_240) {
            __assert_fail("op <= oLitEnd",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa863,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (local_288 <= local_278) {
            __assert_fail("oLitEnd < oMatchEnd",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa864,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (local_248 < local_288) {
            __assert_fail("oMatchEnd <= oend",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa865,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (local_258 < local_298) {
            __assert_fail("iLitEnd <= litLimit",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa866,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (local_290 < local_278) {
            __assert_fail("oLitEnd <= oend_w",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa867,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (local_290 < local_288) {
            __assert_fail("oMatchEnd <= oend_w",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0xa868,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          ZSTD_copy16(local_240,*local_250);
          if ((BIT_DStream_t *)0x10 < local_2c0) {
            local_1a8 = local_240 + 0x10;
            local_1a0 = (void *)((long)*local_250 + 0x10);
            local_188 = &local_2c0[-1].start;
            local_18c = 0;
            local_198 = (long)local_1a8 - (long)local_1a0;
            local_1b0 = local_1a8 + (long)local_188;
            local_180 = local_1a0;
            local_178 = local_1a8;
            if ((local_198 < 0x10) && (-0x10 < local_198)) {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0x36a6,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            ZSTD_copy16(local_1a8,local_1a0);
            if (0x10 < (long)local_188) {
              local_1a8 = local_1a8 + 0x10;
              local_1a0 = (void *)((long)local_1a0 + 0x10);
              do {
                ZSTD_copy16(local_1a8,local_1a0);
                local_1a8 = local_1a8 + 0x10;
                local_1a0 = (void *)((long)local_1a0 + 0x10);
                ZSTD_copy16(local_1a8,local_1a0);
                local_1a8 = local_1a8 + 0x10;
                local_1a0 = (void *)((long)local_1a0 + 0x10);
              } while (local_1a8 < local_1b0);
            }
          }
          local_240 = local_278;
          *local_250 = local_298;
          if (local_278 + -(long)local_260 < local_2b0) {
            if (local_278 + -local_268 < local_2b0) {
              local_238 = (BYTE *)0xffffffffffffffec;
            }
            else {
              local_2a0 = local_270 + ((long)local_2a0 - (long)local_260);
              if (local_270 < local_2a0 + (long)local_2b8) {
                local_2a8 = (long)local_270 - (long)local_2a0;
                memmove(local_278,local_2a0,local_2a8);
                local_240 = local_278 + local_2a8;
                local_2b8 = (BIT_DStream_t *)((long)local_2b8 - local_2a8);
                local_2a0 = local_260;
                goto LAB_0043e354;
              }
              memmove(local_278,local_2a0,(size_t)local_2b8);
              local_238 = local_280;
            }
          }
          else {
LAB_0043e354:
            if (local_288 < local_240) {
              __assert_fail("op <= oMatchEnd",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa888,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (local_290 < local_288) {
              __assert_fail("oMatchEnd <= oend_w",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa889,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (local_2a0 < local_260) {
              __assert_fail("match >= prefixStart",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa88a,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (local_2b8 == (BIT_DStream_t *)0x0) {
              __assert_fail("sequence.matchLength >= 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                            ,0xa88b,
                            "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                           );
            }
            if (local_2b0 < (BYTE *)0x10) {
              if ((BYTE *)0xf < local_2b0) {
                __assert_fail("sequence.offset < WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa898,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              local_8 = &local_240;
              local_10 = &local_2a0;
              local_18 = local_2b0;
              if (local_240 < local_2a0) {
                __assert_fail("*ip <= *op",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa783,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
              }
              if (local_2b0 < (BYTE *)0x8) {
                local_1c = *(int *)(ZSTD_overlapCopy8_dec64table + (long)local_2b0 * 4);
                *local_240 = *local_2a0;
                local_240[1] = local_2a0[1];
                local_240[2] = local_2a0[2];
                local_240[3] = local_2a0[3];
                local_2a0 = local_2a0 +
                            *(uint *)(ZSTD_overlapCopy8_dec32table + (long)local_2b0 * 4);
                ZSTD_copy4(local_240 + 4,local_2a0);
                *local_10 = *local_10 + -(long)local_1c;
              }
              else {
                ZSTD_copy8(local_240,local_2a0);
              }
              *local_10 = *local_10 + 8;
              *local_8 = *local_8 + 8;
              if ((long)*local_8 - (long)*local_10 < 8) {
                __assert_fail("*op - *ip >= 8",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0xa795,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
              }
              if ((BIT_DStream_t *)0x8 < local_2b8) {
                if (local_288 <= local_240) {
                  __assert_fail("op < oMatchEnd",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0xa89f,
                                "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                               );
                }
                local_208 = &local_2b8[-1].limitPtr;
                local_1f8 = local_240;
                local_200 = local_2a0;
                local_20c = 1;
                local_218 = (long)local_240 - (long)local_2a0;
                local_220 = local_2a0;
                local_228 = local_240;
                local_230 = local_240 + (long)local_208;
                if (local_218 < 0x10) {
                  do {
                    ZSTD_copy8(local_228,local_220);
                    local_228 = local_228 + 8;
                    local_220 = local_220 + 8;
                  } while (local_228 < local_230);
                }
                else {
                  if ((local_218 < 0x10) && (-0x10 < local_218)) {
                    __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                  ,0x36a6,
                                  "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                 );
                  }
                  ZSTD_copy16(local_240,local_2a0);
                  if (0x10 < (long)local_208) {
                    local_228 = local_228 + 0x10;
                    local_220 = local_220 + 0x10;
                    do {
                      ZSTD_copy16(local_228,local_220);
                      local_228 = local_228 + 0x10;
                      local_220 = local_220 + 0x10;
                      ZSTD_copy16(local_228,local_220);
                      local_228 = local_228 + 0x10;
                      local_220 = local_220 + 0x10;
                    } while (local_228 < local_230);
                  }
                }
              }
              local_238 = local_280;
            }
            else {
              local_1b8 = local_240;
              local_1c0 = local_2a0;
              local_1c8 = local_2b8;
              local_1cc = 0;
              local_1d8 = (long)local_240 - (long)local_2a0;
              local_1e0 = local_2a0;
              local_1e8 = local_240;
              local_1f0 = local_240 + (long)local_2b8;
              if ((local_1d8 < 0x10) && (-0x10 < local_1d8)) {
                __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                              ,0x36a6,
                              "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                             );
              }
              ZSTD_copy16(local_240,local_2a0);
              if (0x10 < (long)local_1c8) {
                local_1e8 = local_1e8 + 0x10;
                local_1e0 = local_1e0 + 0x10;
                do {
                  ZSTD_copy16(local_1e8,local_1e0);
                  local_1e8 = local_1e8 + 0x10;
                  local_1e0 = local_1e0 + 0x10;
                  ZSTD_copy16(local_1e8,local_1e0);
                  local_1e8 = local_1e8 + 0x10;
                  local_1e0 = local_1e0 + 0x10;
                } while (local_1e8 < local_1f0);
              }
              local_238 = local_280;
            }
          }
        }
        in_stack_fffffffffffffaf8 = local_238;
        uVar2 = ZSTD_isError(0x43eaf3);
        if (uVar2 != 0) {
          return (size_t)in_stack_fffffffffffffaf8;
        }
        local_448 = in_stack_fffffffffffffaf8 + (long)local_448;
        local_414 = local_414 + -1;
        if (local_414 == 0) {
          local_3d8 = &local_4e0;
          if (local_4d8 < 0x41) {
            if (local_4d0 < local_4c0) {
              if (local_4d0 == local_4c8) {
                if (local_4d8 < 0x40) {
                  local_3cc = BIT_DStream_endOfBuffer;
                }
                else {
                  local_3cc = BIT_DStream_completed;
                }
              }
              else {
                local_3dc = local_4d8 >> 3;
                bVar5 = local_4d0 - local_3dc < local_4c8;
                if (bVar5) {
                  local_3dc = (int)local_4d0 - (int)local_4c8;
                }
                local_3e0 = (BIT_DStream_status)bVar5;
                local_4d0 = local_4d0 - local_3dc;
                sVar3 = MEM_readLEST(in_stack_fffffffffffffa68);
                *local_3d8 = sVar3;
                local_3cc = local_3e0;
              }
            }
            else {
              local_3cc = BIT_reloadDStreamFast(in_stack_fffffffffffffa68);
            }
          }
          else {
            local_3cc = BIT_DStream_overflow;
          }
          if (local_3cc < BIT_DStream_completed) {
            return 0xffffffffffffffec;
          }
          for (uVar2 = 0; uVar2 < 3; uVar2 = uVar2 + 1) {
            *(int *)(local_3f0 + 0x683c + (ulong)uVar2 * 4) = (int)local_488[uVar2];
          }
          goto LAB_0043eefe;
        }
        local_3c0 = &local_4e0;
        if (local_4d8 < 0x41) {
          if (local_4d0 < local_4c0) {
            if (local_4d0 == local_4c8) {
              if (local_4d8 < 0x40) {
                local_3b4 = BIT_DStream_endOfBuffer;
              }
              else {
                local_3b4 = BIT_DStream_completed;
              }
            }
            else {
              local_3c4 = local_4d8 >> 3;
              bVar5 = local_4d0 - local_3c4 < local_4c8;
              if (bVar5) {
                local_3c4 = (int)local_4d0 - (int)local_4c8;
              }
              local_3c8 = (BIT_DStream_status)bVar5;
              local_4d0 = local_4d0 - local_3c4;
              local_4d8 = local_4d8 + local_3c4 * -8;
              sVar3 = MEM_readLEST(in_stack_fffffffffffffa68);
              *local_3c0 = sVar3;
              local_3b4 = local_3c8;
            }
          }
          else {
            local_3b4 = BIT_reloadDStreamFast(in_stack_fffffffffffffa68);
          }
        }
        else {
          local_3b4 = BIT_DStream_overflow;
        }
      } while( true );
    }
    local_3e8 = (BYTE *)0xffffffffffffffec;
  }
  return (size_t)local_3e8;
}

Assistant:

DONT_VECTORIZE
ZSTD_decompressSequences_bmi2(ZSTD_DCtx* dctx,
                                 void* dst, size_t maxDstSize,
                           const void* seqStart, size_t seqSize, int nbSeq,
                           const ZSTD_longOffset_e isLongOffset,
                           const int frame)
{
    return ZSTD_decompressSequences_body(dctx, dst, maxDstSize, seqStart, seqSize, nbSeq, isLongOffset, frame);
}